

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O0

loader * __thiscall loader::to_string_abi_cxx11_(loader *this,ze_init_driver_type_desc_t *desc)

{
  ze_init_driver_type_desc_t *desc_local;
  string *flags_value;
  
  std::__cxx11::string::string((string *)this);
  if ((desc->flags & 1) != 0) {
    std::__cxx11::string::operator+=((string *)this,"|ZE_INIT_DRIVER_TYPE_FLAG_GPU|");
  }
  if ((desc->flags & 2) != 0) {
    std::__cxx11::string::operator+=((string *)this,"|ZE_INIT_DRIVER_TYPE_FLAG_NPU|");
  }
  return this;
}

Assistant:

std::string to_string(const ze_init_driver_type_desc_t *desc) {
        std::string flags_value;
        if (desc->flags & ZE_INIT_DRIVER_TYPE_FLAG_GPU) {
            flags_value+= "|ZE_INIT_DRIVER_TYPE_FLAG_GPU|";
        }
        if (desc->flags & ZE_INIT_DRIVER_TYPE_FLAG_NPU) {
            flags_value+= "|ZE_INIT_DRIVER_TYPE_FLAG_NPU|";
        }
        return flags_value;
    }